

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O2

int Ssc_GiaTransferPiPattern(Gia_Man_t *pAig,Gia_Man_t *pCare,Vec_Int_t *vPivot)

{
  int iVar1;
  int iVar2;
  word *pSim;
  Gia_Obj_t *pObj;
  word *pwVar3;
  word *pwVar4;
  ulong uVar5;
  ulong uVar6;
  int v;
  ulong uVar7;
  
  uVar7 = (long)pCare->vSimsPi->nSize / (long)(pCare->vCis->nSize - pCare->nRegs);
  pSim = Ssc_GiaGetCareMask(pCare);
  iVar2 = (int)uVar7;
  iVar1 = Ssc_SimCountBits(pSim,iVar2);
  if (iVar1 != 0) {
    Ssc_GiaResetPiPattern(pAig,iVar2);
    v = 0;
    uVar7 = uVar7 & 0xffffffff;
    if (iVar2 < 1) {
      uVar7 = 0;
    }
    while ((v < pCare->vCis->nSize && (pObj = Gia_ManCi(pCare,v), pObj != (Gia_Obj_t *)0x0))) {
      pwVar3 = Gia_ObjSimPi(pAig,v);
      pwVar4 = Gia_ObjSimObj(pCare,pObj);
      for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        iVar2 = Vec_IntEntry(vPivot,v);
        uVar5 = ~pSim[uVar6] | pwVar4[uVar6];
        if (iVar2 == 0) {
          uVar5 = pSim[uVar6] & pwVar4[uVar6];
        }
        pwVar3[uVar6] = uVar5;
      }
      v = v + 1;
    }
  }
  free(pSim);
  return iVar1;
}

Assistant:

int Ssc_GiaTransferPiPattern( Gia_Man_t * pAig, Gia_Man_t * pCare, Vec_Int_t * vPivot )
{
    extern word * Ssc_GiaGetCareMask( Gia_Man_t * p );
    Gia_Obj_t * pObj;
    int i, w, nWords = Gia_ObjSimWords( pCare );
    word * pCareMask = Ssc_GiaGetCareMask( pCare );
    int Count = Ssc_SimCountBits( pCareMask, nWords );
    word * pSimPiCare, * pSimPiAig;
    if ( Count == 0 )
    {
        ABC_FREE( pCareMask );
        return 0;
    }
    Ssc_GiaResetPiPattern( pAig, nWords );
    Gia_ManForEachCi( pCare, pObj, i )
    {
        pSimPiAig  = Gia_ObjSimPi( pAig, i );
        pSimPiCare = Gia_ObjSimObj( pCare, pObj );
        for ( w = 0; w < nWords; w++ )
            if ( Vec_IntEntry(vPivot, i) )
                pSimPiAig[w] = pSimPiCare[w] | ~pCareMask[w];
            else
                pSimPiAig[w] = pSimPiCare[w] & pCareMask[w];
    }
    ABC_FREE( pCareMask );
    return Count;
}